

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_lsd.cpp
# Opt level: O0

void fill_cache<6u>(Cacheblock<6U> *cache,size_t N,size_t depth)

{
  value_type_conflict vVar1;
  reference pvVar2;
  bool bVar3;
  uint local_2c;
  ulong uStack_28;
  uint j;
  size_t i;
  size_t depth_local;
  size_t N_local;
  Cacheblock<6U> *cache_local;
  
  for (uStack_28 = 0; uStack_28 < N; uStack_28 = uStack_28 + 1) {
    local_2c = 0;
    while( true ) {
      bVar3 = false;
      if (local_2c < 6) {
        bVar3 = cache[uStack_28].ptr[depth + local_2c] != '\0';
      }
      if (!bVar3) break;
      vVar1 = cache[uStack_28].ptr[depth + local_2c];
      pvVar2 = std::array<unsigned_char,_6UL>::operator[](&cache[uStack_28].chars,(ulong)local_2c);
      *pvVar2 = vVar1;
      local_2c = local_2c + 1;
    }
    for (; local_2c < 6; local_2c = local_2c + 1) {
      pvVar2 = std::array<unsigned_char,_6UL>::operator[](&cache[uStack_28].chars,(ulong)local_2c);
      *pvVar2 = '\0';
    }
  }
  return;
}

Assistant:

static void
fill_cache(Cacheblock<CachedChars>* cache, size_t N, size_t depth)
{
	for (size_t i=0; i < N; ++i) {
		unsigned int j=0;
		while (j < CachedChars && cache[i].ptr[depth+j]) {
			cache[i].chars[j] = cache[i].ptr[depth+j];
			++j;
		}
		while (j < CachedChars) {
			cache[i].chars[j] = 0;
			++j;
		}
	}
}